

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char> __thiscall
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (detail *this,basic_appender<char> out,unsigned___int128 value,uint prefix,
          format_specs *specs,digit_grouping<char> *grouping)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 n [16];
  undefined1 value_00 [16];
  size_t sVar5;
  int iVar6;
  uint uVar7;
  char *digits;
  basic_appender<char> bVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  undefined4 in_register_00000014;
  byte *pbVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  undefined8 *in_R9;
  ulong size;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  format_decimal_result<char_*> fVar23;
  char buffer_1 [39];
  memory_buffer buffer;
  undefined4 in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  anon_class_24_3_e2c60416 local_2d8;
  undefined3 uStack_2c0;
  undefined4 uStack_2bd;
  undefined1 uStack_2b9;
  undefined1 uStack_2b8;
  undefined2 uStack_2b7;
  undefined4 uStack_2b5;
  undefined4 uStack_2b1;
  memory_buffer local_248;
  
  uVar13 = CONCAT44(in_register_00000014,prefix);
  uVar7 = (uint)specs;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>.grow_ = basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
  ;
  local_248.super_buffer<char>.capacity_ = 500;
  cVar16 = (char)(grouping->grouping_)._M_string_length;
  switch(cVar16) {
  case '\0':
  case '\x03':
    n._4_4_ = uVar7;
    n._0_4_ = in_stack_fffffffffffffd08;
    n._8_8_ = in_stack_fffffffffffffd10;
    iVar6 = count_digits_fallback<unsigned__int128>((detail *)out.buffer_,(unsigned___int128)n);
    local_2d8.buffer = (memory_buffer *)0x0;
    uStack_2c0 = 0;
    uStack_2bd = 0;
    local_2d8.prefix = (uint *)0x0;
    local_2d8.grouping = (digit_grouping<char> *)0x0;
    uStack_2b9 = 0;
    uStack_2b8 = 0;
    uStack_2b7 = 0;
    uStack_2b5 = 0;
    value_00._4_4_ = uVar7;
    value_00._0_4_ = in_stack_fffffffffffffd08;
    value_00._8_8_ = in_stack_fffffffffffffd10;
    fVar23 = format_decimal<char,unsigned__int128>
                       ((detail *)&local_2d8,(char *)out.buffer_,(unsigned___int128)value_00,prefix)
    ;
    copy_noinline<char,char*,fmt::v11::basic_appender<char>>
              ((char *)&local_2d8,fVar23.end,&local_248.super_buffer<char>);
    goto LAB_00129982;
  default:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/format.h"
                ,0x80e,"");
  case '\x04':
    uVar2 = *(ushort *)((long)&(grouping->grouping_)._M_string_length + 1);
    cVar16 = (char)uVar2;
    if ((uVar2 >> 8 & 1) != 0) {
      uVar14 = (uint)(-1 < cVar16) << 0xd | 0x5830;
      uVar18 = uVar14 << 8;
      if (uVar7 == 0) {
        uVar18 = uVar14;
      }
      uVar7 = (uVar18 | uVar7) + 0x2000000;
    }
    uVar12 = uVar13;
    bVar8.buffer_ = out.buffer_;
    size = 0;
    do {
      uVar20 = size;
      uVar3 = uVar12 << 0x3c;
      size = uVar20 + 1;
      bVar21 = (buffer<char> *)0xf < bVar8.buffer_;
      bVar22 = uVar12 != 0;
      uVar4 = -uVar12;
      uVar12 = uVar12 >> 4;
      bVar8.buffer_ = (buffer<char> *)(uVar3 | (ulong)bVar8.buffer_ >> 4);
    } while (bVar22 || uVar4 < bVar21);
    if (500 < size) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
    }
    pcVar9 = local_248.super_buffer<char>.ptr_;
    sVar5 = size;
    if (local_248.super_buffer<char>.capacity_ < size) {
      pcVar9 = (char *)0x0;
      sVar5 = local_248.super_buffer<char>.size_;
    }
    local_248.super_buffer<char>.size_ = sVar5;
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)((long)&local_2d8.prefix + uVar20);
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      uStack_2b8 = 0;
      pcVar10 = "0123456789ABCDEF";
      if (-1 < cVar16) {
        pcVar10 = "0123456789abcdef";
      }
      do {
        *pcVar9 = pcVar10[(uint)out.buffer_ & 0xf];
        pcVar9 = pcVar9 + -1;
        bVar21 = (buffer<char> *)0xf < out.buffer_;
        bVar22 = uVar13 != 0;
        uVar12 = -uVar13;
        out.buffer_ = (buffer<char> *)(uVar13 << 0x3c | (ulong)out.buffer_ >> 4);
        uVar13 = uVar13 >> 4;
      } while (bVar22 || uVar12 < bVar21);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar20 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar10 = "0123456789ABCDEF";
      if (-1 < cVar16) {
        pcVar10 = "0123456789abcdef";
      }
      pcVar9 = pcVar9 + size;
      do {
        pcVar9 = pcVar9 + -1;
        uVar12 = uVar13 << 0x3c;
        *pcVar9 = pcVar10[(uint)out.buffer_ & 0xf];
        bVar21 = (out.buffer_ < (buffer<char> *)0x10) <= uVar13;
        uVar13 = uVar13 >> 4;
        out.buffer_ = (buffer<char> *)(uVar12 | (ulong)out.buffer_ >> 4);
      } while (bVar21);
    }
    break;
  case '\x05':
    uVar12 = uVar13;
    bVar8.buffer_ = out.buffer_;
    size = 0;
    do {
      uVar20 = size;
      uVar3 = uVar12 << 0x3d;
      size = uVar20 + 1;
      bVar21 = (buffer<char> *)0x7 < bVar8.buffer_;
      bVar22 = uVar12 != 0;
      uVar4 = -uVar12;
      uVar12 = uVar12 >> 3;
      bVar8.buffer_ = (buffer<char> *)(uVar3 | (ulong)bVar8.buffer_ >> 3);
    } while (bVar22 || uVar4 < bVar21);
    if ((((grouping->grouping_)._M_string_length & 0x10000) != 0) &&
       ((out.buffer_ != (buffer<char> *)0x0 || uVar13 != 0) &&
        *(int *)((long)&(grouping->grouping_)._M_dataplus._M_p + 4) <= (int)size)) {
      uVar18 = 0x3000;
      if (uVar7 == 0) {
        uVar18 = 0x30;
      }
      uVar7 = (uVar18 | uVar7) + 0x1000000;
    }
    if (500 < size) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
    }
    pcVar9 = local_248.super_buffer<char>.ptr_;
    sVar5 = size;
    if (local_248.super_buffer<char>.capacity_ < size) {
      pcVar9 = (char *)0x0;
      sVar5 = local_248.super_buffer<char>.size_;
    }
    local_248.super_buffer<char>.size_ = sVar5;
    if (pcVar9 == (char *)0x0) {
      pbVar11 = (byte *)((long)&local_2d8.prefix + uVar20);
      uStack_2b8 = 0;
      uStack_2b7 = 0;
      uStack_2b5 = 0;
      uStack_2b1 = 0;
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      do {
        *pbVar11 = (byte)out.buffer_ & 7 | 0x30;
        uVar12 = uVar13 << 0x3d;
        pbVar11 = pbVar11 + -1;
        bVar21 = (buffer<char> *)0x7 < out.buffer_;
        bVar22 = uVar13 != 0;
        uVar3 = -uVar13;
        uVar13 = uVar13 >> 3;
        out.buffer_ = (buffer<char> *)(uVar12 | (ulong)out.buffer_ >> 3);
      } while (bVar22 || uVar3 < bVar21);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar20 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar9 = pcVar9 + size;
      do {
        pcVar9 = pcVar9 + -1;
        uVar12 = uVar13 << 0x3d;
        *pcVar9 = (byte)out.buffer_ & 7 | 0x30;
        bVar21 = (out.buffer_ < (buffer<char> *)0x8) <= uVar13;
        uVar13 = uVar13 >> 3;
        out.buffer_ = (buffer<char> *)(uVar12 | (ulong)out.buffer_ >> 3);
      } while (bVar21);
    }
    break;
  case '\x06':
    uVar2 = *(ushort *)((long)&(grouping->grouping_)._M_string_length + 1);
    if ((uVar2 >> 8 & 1) != 0) {
      uVar14 = (uint)(-1 < (char)uVar2) << 0xd | 0x4230;
      uVar18 = uVar14 << 8;
      if (uVar7 == 0) {
        uVar18 = uVar14;
      }
      uVar7 = (uVar18 | uVar7) + 0x2000000;
    }
    uVar12 = uVar13;
    bVar8.buffer_ = out.buffer_;
    size = 0;
    do {
      uVar20 = size;
      uVar3 = uVar12 << 0x3f;
      size = uVar20 + 1;
      bVar21 = (buffer<char> *)0x1 < bVar8.buffer_;
      bVar22 = uVar12 != 0;
      uVar4 = -uVar12;
      uVar12 = uVar12 >> 1;
      bVar8.buffer_ = (buffer<char> *)(uVar3 | (ulong)bVar8.buffer_ >> 1);
    } while (bVar22 || uVar4 < bVar21);
    if (500 < size) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
    }
    pcVar9 = local_248.super_buffer<char>.ptr_;
    sVar5 = size;
    if (local_248.super_buffer<char>.capacity_ < size) {
      pcVar9 = (char *)0x0;
      sVar5 = local_248.super_buffer<char>.size_;
    }
    local_248.super_buffer<char>.size_ = sVar5;
    if (pcVar9 == (char *)0x0) {
      pbVar11 = (byte *)((long)&local_2d8.prefix + uVar20);
      memset(&local_2d8,0,0x81);
      do {
        *pbVar11 = (byte)out.buffer_ & 1 | 0x30;
        uVar12 = uVar13 << 0x3f;
        pbVar11 = pbVar11 + -1;
        bVar21 = (buffer<char> *)0x1 < out.buffer_;
        bVar22 = uVar13 != 0;
        uVar3 = -uVar13;
        uVar13 = uVar13 >> 1;
        out.buffer_ = (buffer<char> *)(uVar12 | (ulong)out.buffer_ >> 1);
      } while (bVar22 || uVar3 < bVar21);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar20 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar9 = pcVar9 + size;
      do {
        pcVar9 = pcVar9 + -1;
        uVar12 = uVar13 << 0x3f;
        *pcVar9 = (byte)out.buffer_ & 1 | 0x30;
        bVar21 = (out.buffer_ < (buffer<char> *)0x2) <= uVar13;
        uVar13 = uVar13 >> 1;
        out.buffer_ = (buffer<char> *)(uVar12 | (ulong)out.buffer_ >> 1);
      } while (bVar21);
    }
    break;
  case '\a':
    local_2d8.prefix._0_2_ = CONCAT11((char)out.buffer_,cVar16 == '\x01');
    bVar8 = write_padded<char,(fmt::v11::align::type)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      ((basic_appender<char>)this,(format_specs *)grouping,1,1,
                       (anon_class_2_2_bf5026b7 *)&local_2d8);
    goto LAB_00129a0f;
  }
  iVar6 = (int)size;
LAB_00129982:
  if (iVar6 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/base.h"
                ,0x1b1,"negative value");
  }
  pbVar11 = (byte *)*in_R9;
  pbVar15 = pbVar11 + in_R9[1];
  uVar7 = (iVar6 + (uVar7 >> 0x18)) - 1;
  iVar17 = 0;
  do {
    iVar19 = 0x7fffffff;
    if (in_R9[5] != 0) {
      if (pbVar11 == pbVar15) {
        uVar18 = (uint)(char)pbVar15[-1];
      }
      else {
        bVar1 = *pbVar11;
        if ((byte)(bVar1 + 0x81) < 0x82) goto LAB_001299da;
        pbVar11 = pbVar11 + 1;
        uVar18 = (uint)bVar1;
      }
      iVar17 = iVar17 + uVar18;
      iVar19 = iVar17;
    }
LAB_001299da:
    uVar7 = uVar7 + 1;
  } while (iVar19 < iVar6);
  local_2d8.prefix = (uint *)&stack0xfffffffffffffd0c;
  local_2d8.buffer = &local_248;
  bVar8 = write_padded<char,(fmt::v11::align::type)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,(format_specs *)grouping,(ulong)uVar7,(ulong)uVar7,
                     &local_2d8);
LAB_00129a0f:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
  return (basic_appender<char>)bVar8.buffer_;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  default:
    FMT_ASSERT(false, "");
    FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt)
      prefix_append(prefix, unsigned(specs.upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, specs.upper);
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt)
      prefix_append(prefix, unsigned(specs.upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}